

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

RegOpnd * __thiscall Inline::GetCallbackFunctionOpnd(Inline *this,Instr *callInstr)

{
  RegOpnd *this_00;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  StackSym *pSVar4;
  PropertySymOpnd *this_01;
  undefined4 *puVar5;
  Instr *pIVar6;
  Instr *pIVar7;
  
  pSVar4 = IR::Opnd::GetStackSym(callInstr->m_src1);
  pIVar7 = (Instr *)0x0;
  pIVar6 = (Instr *)0x0;
  if ((pSVar4->field_0x18 & 1) != 0) {
    pIVar6 = (pSVar4->field_5).m_instrDef;
  }
  this_01 = IR::Opnd::AsPropertySymOpnd(pIVar6->m_src1);
  pSVar4 = IR::PropertySymOpnd::GetObjectSym(this_01);
  if ((pSVar4->field_0x18 & 1) != 0) {
    pIVar7 = (pSVar4->field_5).m_instrDef;
  }
  this_00 = (RegOpnd *)pIVar7->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return this_00;
}

Assistant:

IR::RegOpnd * Inline::GetCallbackFunctionOpnd(IR::Instr * callInstr)
{
    IR::Instr * callApplyLdInstr = callInstr->GetSrc1()->GetStackSym()->GetInstrDef();
    IR::Instr * targetDefInstr = callApplyLdInstr->GetSrc1()->AsPropertySymOpnd()->GetObjectSym()->GetInstrDef();
    return targetDefInstr->GetDst()->AsRegOpnd();
}